

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O1

void __thiscall
TPZPostProcAnalysis::TPZPostProcAnalysis(TPZPostProcAnalysis *this,TPZCompMesh *pRef)

{
  TPZLinearAnalysis::TPZLinearAnalysis(&this->super_TPZLinearAnalysis,&PTR_PTR_01997cf8);
  (this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZPostProcAnalysis_01997be8;
  this->fpMainMesh = pRef;
  (this->fReferredElements)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b8b0;
  (this->fReferredElements).fStore = (TPZCompEl **)0x0;
  (this->fReferredElements).fNElements = 0;
  (this->fReferredElements).fNAlloc = 0;
  SetCompMesh(this,pRef,false);
  return;
}

Assistant:

TPZPostProcAnalysis::TPZPostProcAnalysis(TPZCompMesh * pRef):TPZRegisterClassId(&TPZPostProcAnalysis::ClassId),
TPZLinearAnalysis(), fpMainMesh(pRef)
{
    
    SetCompMesh(pRef);
    
}